

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::date_format<char>::date_format
          (date_format<char> *this,DateFormat *fmt,string *codepage)

{
  string *in_RDX;
  DateFormat *in_RSI;
  unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *in_RDI;
  cpcvt_type in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  icu_std_converter<char,_1> *in_stack_ffffffffffffffd0;
  
  formatter<char>::formatter((formatter<char> *)in_RDI);
  ((base_formatter *)&in_RDI->_M_t)->_vptr_base_formatter = (_func_int **)&PTR__date_format_002eaf70
  ;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RDX);
  icu_std_converter<char,_1>::icu_std_converter
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::unique_ptr<icu_70::DateFormat,std::default_delete<icu_70::DateFormat>>::
  unique_ptr<std::default_delete<icu_70::DateFormat>,void>(in_RDI);
  in_RDI[8]._M_t.super___uniq_ptr_impl<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_>
  ._M_t.super__Tuple_impl<0UL,_icu_70::DateFormat_*,_std::default_delete<icu_70::DateFormat>_>.
  super__Head_base<0UL,_icu_70::DateFormat_*,_false>._M_head_impl = in_RSI;
  return;
}

Assistant:

date_format(icu::DateFormat *fmt,std::string codepage) :
                cvt_(codepage),
                icu_fmt_(fmt)
            {
            }